

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Linker.cpp
# Opt level: O0

void __thiscall
Linker::CollectDebugInfo(Linker *this,FastVector<unsigned_char_*,_false,_false> *instAddress)

{
  uint uVar1;
  uint uVar2;
  uchar *puVar3;
  uint *puStack_20;
  uint zero;
  uchar *pos;
  FastVector<unsigned_char_*,_false,_false> *instAddress_local;
  Linker *this_local;
  
  nullcModuleBytecodeSize = 0;
  uVar1 = NULLC::GetArrayDataSize<ExternTypeInfo>(&this->exTypes);
  nullcModuleBytecodeSize = (ulong)uVar1 + 4 + nullcModuleBytecodeSize;
  uVar1 = NULLC::GetArrayDataSize<ExternMemberInfo>(&this->exTypeExtra);
  nullcModuleBytecodeSize = (ulong)uVar1 + 4 + nullcModuleBytecodeSize;
  uVar1 = NULLC::GetArrayDataSize<ExternConstantInfo>(&this->exTypeConstants);
  nullcModuleBytecodeSize = (ulong)uVar1 + 4 + nullcModuleBytecodeSize;
  uVar1 = NULLC::GetArrayDataSize<ExternVarInfo>(&this->exVariables);
  nullcModuleBytecodeSize = (ulong)uVar1 + 4 + nullcModuleBytecodeSize;
  uVar1 = NULLC::GetArrayDataSize<ExternFuncInfo>(&this->exFunctions);
  nullcModuleBytecodeSize = (ulong)uVar1 + 4 + nullcModuleBytecodeSize;
  uVar1 = NULLC::GetArrayDataSize<unsigned_int>(&this->exFunctionExplicitTypeArrayOffsets);
  nullcModuleBytecodeSize = (ulong)uVar1 + 4 + nullcModuleBytecodeSize;
  uVar1 = NULLC::GetArrayDataSize<unsigned_int>(&this->exFunctionExplicitTypes);
  nullcModuleBytecodeSize = (ulong)uVar1 + 4 + nullcModuleBytecodeSize;
  uVar1 = NULLC::GetArrayDataSize<ExternLocalInfo>(&this->exLocals);
  nullcModuleBytecodeSize = (ulong)uVar1 + 4 + nullcModuleBytecodeSize;
  uVar1 = NULLC::GetArrayDataSize<ExternModuleInfo>(&this->exModules);
  nullcModuleBytecodeSize = (ulong)uVar1 + 4 + nullcModuleBytecodeSize;
  uVar1 = NULLC::GetArrayDataSize<char>(&this->exSymbols);
  nullcModuleBytecodeSize = (ulong)uVar1 + 4 + nullcModuleBytecodeSize;
  uVar1 = NULLC::GetArrayDataSize<char>(&this->exSource);
  nullcModuleBytecodeSize = (ulong)uVar1 + 4 + nullcModuleBytecodeSize;
  uVar1 = NULLC::GetArrayDataSize<char>(&this->exImportPaths);
  nullcModuleBytecodeSize = (ulong)uVar1 + 4 + nullcModuleBytecodeSize;
  uVar1 = NULLC::GetArrayDataSize<char>(&this->exMainModuleName);
  nullcModuleBytecodeSize = (ulong)uVar1 + 4 + nullcModuleBytecodeSize;
  uVar1 = NULLC::GetArrayDataSize<RegVmCmd>(&this->exRegVmCode);
  nullcModuleBytecodeSize = (ulong)uVar1 + 4 + nullcModuleBytecodeSize;
  uVar1 = NULLC::GetArrayDataSize<ExternSourceInfo>(&this->exRegVmSourceInfo);
  nullcModuleBytecodeSize = (ulong)uVar1 + 4 + nullcModuleBytecodeSize;
  uVar1 = NULLC::GetArrayDataSize<unsigned_int>(&this->exRegVmConstants);
  nullcModuleBytecodeSize = (ulong)uVar1 + 4 + nullcModuleBytecodeSize;
  if (instAddress == (FastVector<unsigned_char_*,_false,_false> *)0x0) {
    nullcModuleBytecodeSize = nullcModuleBytecodeSize + 4;
  }
  else {
    uVar1 = NULLC::GetArrayDataSize<unsigned_char*>(instAddress);
    nullcModuleBytecodeSize = (ulong)uVar1 + 4 + nullcModuleBytecodeSize;
  }
  nullcModuleBytecodeSize = nullcModuleBytecodeSize + 4;
  FastVector<unsigned_char,_false,_false>::resize
            (&this->fullLinkerData,(uint)nullcModuleBytecodeSize);
  puVar3 = (this->fullLinkerData).data;
  uVar1 = NULLC::WriteArraySizeAndData<ExternTypeInfo>(puVar3,&this->exTypes);
  puVar3 = puVar3 + uVar1;
  uVar1 = NULLC::WriteArraySizeAndData<ExternMemberInfo>(puVar3,&this->exTypeExtra);
  puVar3 = puVar3 + uVar1;
  uVar1 = NULLC::WriteArraySizeAndData<ExternConstantInfo>(puVar3,&this->exTypeConstants);
  puVar3 = puVar3 + uVar1;
  uVar1 = NULLC::WriteArraySizeAndData<ExternVarInfo>(puVar3,&this->exVariables);
  puVar3 = puVar3 + uVar1;
  uVar1 = NULLC::WriteArraySizeAndData<ExternFuncInfo>(puVar3,&this->exFunctions);
  puVar3 = puVar3 + uVar1;
  uVar1 = NULLC::WriteArraySizeAndData<unsigned_int>
                    (puVar3,&this->exFunctionExplicitTypeArrayOffsets);
  puVar3 = puVar3 + uVar1;
  uVar1 = NULLC::WriteArraySizeAndData<unsigned_int>(puVar3,&this->exFunctionExplicitTypes);
  puVar3 = puVar3 + uVar1;
  uVar1 = NULLC::WriteArraySizeAndData<ExternLocalInfo>(puVar3,&this->exLocals);
  puVar3 = puVar3 + uVar1;
  uVar1 = NULLC::WriteArraySizeAndData<ExternModuleInfo>(puVar3,&this->exModules);
  puVar3 = puVar3 + uVar1;
  uVar1 = NULLC::WriteArraySizeAndData<char>(puVar3,&this->exSymbols);
  puVar3 = puVar3 + uVar1;
  uVar1 = NULLC::WriteArraySizeAndData<char>(puVar3,&this->exSource);
  puVar3 = puVar3 + uVar1;
  uVar1 = NULLC::WriteArraySizeAndData<char>(puVar3,&this->exImportPaths);
  puVar3 = puVar3 + uVar1;
  uVar1 = NULLC::WriteArraySizeAndData<char>(puVar3,&this->exMainModuleName);
  puVar3 = puVar3 + uVar1;
  uVar1 = NULLC::WriteArraySizeAndData<RegVmCmd>(puVar3,&this->exRegVmCode);
  puVar3 = puVar3 + uVar1;
  uVar1 = NULLC::WriteArraySizeAndData<ExternSourceInfo>(puVar3,&this->exRegVmSourceInfo);
  uVar2 = NULLC::WriteArraySizeAndData<unsigned_int>(puVar3 + uVar1,&this->exRegVmConstants);
  puVar3 = puVar3 + uVar1 + uVar2;
  if (instAddress == (FastVector<unsigned_char_*,_false,_false> *)0x0) {
    puVar3[0] = '\0';
    puVar3[1] = '\0';
    puVar3[2] = '\0';
    puVar3[3] = '\0';
    puStack_20 = (uint *)(puVar3 + 4);
  }
  else {
    uVar1 = NULLC::WriteArraySizeAndData<unsigned_char*>(puVar3,instAddress);
    puStack_20 = (uint *)(puVar3 + uVar1);
  }
  *puStack_20 = this->globalVarSize;
  nullcModuleBytecodeLocation = (uintptr_t)(this->fullLinkerData).data;
  nullcModuleBytecodeVersion = nullcModuleBytecodeVersion + 1;
  return;
}

Assistant:

void Linker::CollectDebugInfo(FastVector<unsigned char*> *instAddress)
{
	nullcModuleBytecodeSize = 0;

	nullcModuleBytecodeSize += sizeof(unsigned) + NULLC::GetArrayDataSize(exTypes);
	nullcModuleBytecodeSize += sizeof(unsigned) + NULLC::GetArrayDataSize(exTypeExtra);
	nullcModuleBytecodeSize += sizeof(unsigned) + NULLC::GetArrayDataSize(exTypeConstants);
	nullcModuleBytecodeSize += sizeof(unsigned) + NULLC::GetArrayDataSize(exVariables);
	nullcModuleBytecodeSize += sizeof(unsigned) + NULLC::GetArrayDataSize(exFunctions);
	nullcModuleBytecodeSize += sizeof(unsigned) + NULLC::GetArrayDataSize(exFunctionExplicitTypeArrayOffsets);
	nullcModuleBytecodeSize += sizeof(unsigned) + NULLC::GetArrayDataSize(exFunctionExplicitTypes);
	nullcModuleBytecodeSize += sizeof(unsigned) + NULLC::GetArrayDataSize(exLocals);
	nullcModuleBytecodeSize += sizeof(unsigned) + NULLC::GetArrayDataSize(exModules);
	nullcModuleBytecodeSize += sizeof(unsigned) + NULLC::GetArrayDataSize(exSymbols);
	nullcModuleBytecodeSize += sizeof(unsigned) + NULLC::GetArrayDataSize(exSource);
	nullcModuleBytecodeSize += sizeof(unsigned) + NULLC::GetArrayDataSize(exImportPaths);
	nullcModuleBytecodeSize += sizeof(unsigned) + NULLC::GetArrayDataSize(exMainModuleName);
	nullcModuleBytecodeSize += sizeof(unsigned) + NULLC::GetArrayDataSize(exRegVmCode);
	nullcModuleBytecodeSize += sizeof(unsigned) + NULLC::GetArrayDataSize(exRegVmSourceInfo);
	nullcModuleBytecodeSize += sizeof(unsigned) + NULLC::GetArrayDataSize(exRegVmConstants);

	if(instAddress)
		nullcModuleBytecodeSize += sizeof(unsigned) + NULLC::GetArrayDataSize(*instAddress);
	else
		nullcModuleBytecodeSize += sizeof(unsigned);

	nullcModuleBytecodeSize += sizeof(unsigned); // exLinker->globalVarSize

	fullLinkerData.resize((unsigned)nullcModuleBytecodeSize);

	unsigned char *pos = fullLinkerData.data;

	pos += NULLC::WriteArraySizeAndData(pos, exTypes);
	pos += NULLC::WriteArraySizeAndData(pos, exTypeExtra);
	pos += NULLC::WriteArraySizeAndData(pos, exTypeConstants);
	pos += NULLC::WriteArraySizeAndData(pos, exVariables);
	pos += NULLC::WriteArraySizeAndData(pos, exFunctions);
	pos += NULLC::WriteArraySizeAndData(pos, exFunctionExplicitTypeArrayOffsets);
	pos += NULLC::WriteArraySizeAndData(pos, exFunctionExplicitTypes);
	pos += NULLC::WriteArraySizeAndData(pos, exLocals);
	pos += NULLC::WriteArraySizeAndData(pos, exModules);
	pos += NULLC::WriteArraySizeAndData(pos, exSymbols);
	pos += NULLC::WriteArraySizeAndData(pos, exSource);
	pos += NULLC::WriteArraySizeAndData(pos, exImportPaths);
	pos += NULLC::WriteArraySizeAndData(pos, exMainModuleName);
	pos += NULLC::WriteArraySizeAndData(pos, exRegVmCode);
	pos += NULLC::WriteArraySizeAndData(pos, exRegVmSourceInfo);
	pos += NULLC::WriteArraySizeAndData(pos, exRegVmConstants);

	if(instAddress)
	{
		pos += NULLC::WriteArraySizeAndData(pos, *instAddress);
	}
	else
	{
		unsigned zero = 0;
		memcpy(pos, &zero, sizeof(zero));
		pos += sizeof(zero);
	}


	memcpy(pos, &globalVarSize, sizeof(globalVarSize));
	pos += sizeof(globalVarSize);

	nullcModuleBytecodeLocation = uintptr_t(fullLinkerData.data);

	nullcModuleBytecodeVersion += 1;
}